

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O2

bool cmTargetPrecompileHeadersCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  allocator<char> local_71;
  string local_70;
  cmTargetPropCommandBase local_50;
  
  cmTargetPropCommandBase::cmTargetPropCommandBase(&local_50,status);
  local_50._vptr_cmTargetPropCommandBase = (_func_int **)&PTR__cmTargetPropCommandBase_0089f630;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"PRECOMPILE_HEADERS",&local_71);
  bVar1 = cmTargetPropCommandBase::HandleArguments(&local_50,args,&local_70,PROCESS_REUSE_FROM);
  std::__cxx11::string::~string((string *)&local_70);
  cmTargetPropCommandBase::~cmTargetPropCommandBase(&local_50);
  return bVar1;
}

Assistant:

bool cmTargetPrecompileHeadersCommand(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  return TargetPrecompileHeadersImpl(status).HandleArguments(
    args, "PRECOMPILE_HEADERS",
    TargetPrecompileHeadersImpl::PROCESS_REUSE_FROM);
}